

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

void __thiscall QString::reserve(QString *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  
  pDVar3 = (this->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar3->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <=
      asize)) {
    lVar2 = (this->d).size;
    if (asize < lVar2) {
      asize = lVar2;
    }
    ::QString::reallocData((longlong)this,(AllocationOption)asize);
    pDVar3 = (this->d).d;
    if (pDVar3 == (Data *)0x0) {
      return;
    }
  }
  if ((pDVar3->super_QArrayData).alloc != 0) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  return;
}

Assistant:

void QString::reserve(qsizetype asize)
{
    if (d.needsDetach() || asize >= capacity() - d.freeSpaceAtBegin())
        reallocData(qMax(asize, size()), QArrayData::KeepSize);
    if (d.constAllocatedCapacity())
        d.setFlag(Data::CapacityReserved);
}